

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertRotationKeys
          (FBXConverter *this,aiNodeAnim *na,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *nodes,LayerMap *param_3,int64_t start,int64_t stop,double *maxTime,double *minTime,
          RotOrder order)

{
  undefined1 auVar1 [16];
  vector<long,_std::allocator<long>_> *keys_00;
  KeyFrameListList *inputs_00;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiQuatKey *paVar5;
  aiQuatKey *local_b8;
  aiVector3t<float> local_90 [2];
  KeyTimeList local_78;
  vector<long,_std::allocator<long>_> *local_60;
  KeyTimeList *keys;
  KeyFrameListList *local_40;
  vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
  *inputs;
  int64_t stop_local;
  int64_t start_local;
  LayerMap *param_3_local;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *nodes_local;
  aiNodeAnim *na_local;
  FBXConverter *this_local;
  
  inputs = (vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            *)stop;
  stop_local = start;
  start_local = (int64_t)param_3;
  param_3_local = (LayerMap *)nodes;
  nodes_local = (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                 *)na;
  na_local = (aiNodeAnim *)this;
  sVar3 = std::
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          ::size(nodes);
  if (sVar3 != 0) {
    GetKeyframeList((KeyFrameListList *)&keys,this,
                    (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                     *)param_3_local,stop_local,(int64_t)inputs);
    local_40 = (KeyFrameListList *)&keys;
    GetKeyTimeList(&local_78,this,(KeyFrameListList *)&keys);
    local_60 = &local_78;
    sVar3 = std::vector<long,_std::allocator<long>_>::size(local_60);
    *(int *)&nodes_local[0x2b].
             super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = (int)sVar3;
    sVar3 = std::vector<long,_std::allocator<long>_>::size(local_60);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0x18),0);
    if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    paVar5 = (aiQuatKey *)operator_new__(uVar4);
    if (sVar3 != 0) {
      local_b8 = paVar5;
      do {
        aiQuatKey::aiQuatKey(local_b8);
        local_b8 = local_b8 + 1;
      } while (local_b8 != paVar5 + sVar3);
    }
    nodes_local[0x2b].
    super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar5;
    bVar2 = std::vector<long,_std::allocator<long>_>::empty(local_60);
    inputs_00 = local_40;
    keys_00 = local_60;
    if (!bVar2) {
      paVar5 = (aiQuatKey *)
               nodes_local[0x2b].
               super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      aiVector3t<float>::aiVector3t(local_90,0.0,0.0,0.0);
      InterpolateKeys(this,paVar5,keys_00,inputs_00,local_90,maxTime,minTime,order);
    }
    std::vector<long,_std::allocator<long>_>::~vector(&local_78);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               *)&keys);
    return;
  }
  __assert_fail("nodes.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                ,0xe0d,
                "void Assimp::FBX::FBXConverter::ConvertRotationKeys(aiNodeAnim *, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &, Model::RotOrder)"
               );
}

Assistant:

void FBXConverter::ConvertRotationKeys(aiNodeAnim* na, const std::vector<const AnimationCurveNode*>& nodes,
            const LayerMap& /*layers*/,
            int64_t start, int64_t stop,
            double& maxTime,
            double& minTime,
            Model::RotOrder order)
        {
            ai_assert(nodes.size());

            // XXX see notes in ConvertScaleKeys()
            const std::vector< KeyFrameList >& inputs = GetKeyframeList(nodes, start, stop);
            const KeyTimeList& keys = GetKeyTimeList(inputs);

            na->mNumRotationKeys = static_cast<unsigned int>(keys.size());
            na->mRotationKeys = new aiQuatKey[keys.size()];
            if (!keys.empty()) {
                InterpolateKeys(na->mRotationKeys, keys, inputs, aiVector3D(0.0f, 0.0f, 0.0f), maxTime, minTime, order);
            }
        }